

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Vec_Int_t * Gia_ManCollectReach2(Gia_Man_t *p,int fSecond)

{
  int iVar1;
  Vec_Int_t *vNodes;
  int *piVar2;
  ulong uVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  long lVar6;
  
  iVar1 = p->nObjs;
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 << 2);
  }
  vNodes->pArray = piVar2;
  Gia_ManIncrementTravId(p);
  if (0 < p->nObjs) {
    if (p->nTravIdsAlloc < 1) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x262,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    *p->pTravIds = p->nTravIds;
    pVVar5 = p->vCos;
    uVar3 = (ulong)(uint)pVVar5->nSize;
    if (0 < pVVar5->nSize) {
      lVar6 = 0;
      do {
        iVar1 = pVVar5->pArray[lVar6];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if ((uint)(lVar6 < (int)(((uint)(uVar3 >> 0x1f) & 1) + (int)uVar3) >> 1) != fSecond) {
          Gia_ManCollectDfs_rec(p,iVar1 - (*(uint *)(p->pObjs + iVar1) & 0x1fffffff),vNodes);
        }
        lVar6 = lVar6 + 1;
        pVVar5 = p->vCos;
        uVar3 = (ulong)pVVar5->nSize;
      } while (lVar6 < (long)uVar3);
    }
    return vNodes;
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

Vec_Int_t * Gia_ManCollectReach2( Gia_Man_t * p, int fSecond )
{
    int i, iDriver;
    Vec_Int_t * vNodes = Vec_IntAlloc( Gia_ManObjNum(p) );
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Gia_ManForEachCoDriverId( p, iDriver, i )
        if ( (i < Gia_ManCoNum(p)/2) ^ fSecond )
            Gia_ManCollectDfs_rec( p, iDriver, vNodes );
    return vNodes;
}